

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTrans.h
# Opt level: O0

void __thiscall ModelTrans::PyrDown(ModelTrans *this,char *pImage,char *dst,int width,int height)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int local_38;
  int local_34;
  int j;
  int i;
  int curIndex;
  int newWidth;
  int height_local;
  int width_local;
  char *dst_local;
  char *pImage_local;
  ModelTrans *this_local;
  
  for (local_34 = 0; local_34 < height; local_34 = local_34 + 3) {
    j = local_34 * width;
    for (local_38 = 0; local_38 < width; local_38 = local_38 + 3) {
      lVar1 = (long)j;
      lVar3 = (long)(j + width);
      lVar2 = (long)(j + width * 2);
      dst[(local_34 / 3) * (width / 3) + local_38 / 3] =
           (char)(int)((float)(int)pImage[lVar2 + 2] * pryDownKernel[2][2] +
                      (float)(int)pImage[lVar2 + 1] * pryDownKernel[2][1] +
                      (float)(int)pImage[lVar2] * pryDownKernel[2][0] +
                      (float)(int)pImage[lVar3 + 2] * pryDownKernel[1][2] +
                      (float)(int)pImage[lVar3 + 1] * pryDownKernel[1][1] +
                      (float)(int)pImage[lVar3] * pryDownKernel[1][0] +
                      (float)(int)pImage[lVar1 + 2] * pryDownKernel[0][2] +
                      (float)(int)pImage[lVar1] * pryDownKernel[0][0] +
                      (float)(int)pImage[lVar1 + 1] * pryDownKernel[0][1]);
      j = j + 3;
    }
  }
  return;
}

Assistant:

void ModelTrans::PyrDown(char* pImage,char* dst, int width = 72, int height = 144)
{
    int newWidth = width/3;
    int curIndex = 0;
    for(int i = 0; i < height; i += 3)
    {
        curIndex = i*width;
        for(int j = 0; j < width; j += 3)
        {
            dst[(i/3)*newWidth + j/3] = pImage[curIndex]*pryDownKernel[0][0] + pImage[curIndex + 1]*pryDownKernel[0][1] +
                                        pImage[curIndex + 2]*pryDownKernel[0][2] + pImage[curIndex + width]*pryDownKernel[1][0] + pImage[curIndex + width + 1]*pryDownKernel[1][1] +
                                        pImage[curIndex + width + 2]*pryDownKernel[1][2] + pImage[curIndex + 2*width]*pryDownKernel[2][0] + pImage[curIndex + 2*width + 1]*pryDownKernel[2][1]+
                                        pImage[curIndex + 2*width + 2]*pryDownKernel[2][2];
            curIndex += 3;
        }
    }
}